

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

void Saig_TsiStop(Saig_Tsim_t *p)

{
  Saig_Tsim_t *p_local;
  
  if (p->vNonXRegs != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vNonXRegs);
  }
  Aig_MmFixedStop(p->pMem,0);
  Vec_PtrFree(p->vStates);
  if (p->pBins != (uint **)0x0) {
    free(p->pBins);
    p->pBins = (uint **)0x0;
  }
  if (p != (Saig_Tsim_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Saig_TsiStop( Saig_Tsim_t * p )
{
    if ( p->vNonXRegs )
        Vec_IntFree( p->vNonXRegs );
    Aig_MmFixedStop( p->pMem, 0 );
    Vec_PtrFree( p->vStates );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}